

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parametric.cxx
# Opt level: O2

string * __thiscall
Parametric::getAllParameters_abi_cxx11_(string *__return_storage_ptr__,Parametric *this)

{
  pointer pbVar1;
  uint i;
  uint uVar2;
  ulong uVar3;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  parametricOutputIndent = parametricOutputIndent + 1;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"",(allocator<char> *)&local_70);
  for (uVar2 = 0; uVar2 < parametricOutputIndent; uVar2 = uVar2 + 1) {
    std::__cxx11::string::append((char *)&local_d0);
  }
  uVar2 = 0;
  while( true ) {
    uVar3 = (ulong)uVar2;
    pbVar1 = (this->parametricStrings).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->parametricStrings).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar3)
    break;
    parametricOutputLineEnd = true;
    std::operator+(&local_b0,&local_d0,pbVar1 + uVar3);
    std::operator+(&local_90,&local_b0,": ");
    (*this->_vptr_Parametric[3])
              (&local_50,this,
               (this->parametricStrings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar3);
    std::operator+(&local_70,&local_90,&local_50);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    if (parametricOutputLineEnd == true) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      parametricOutputLineEnd = false;
    }
    uVar2 = uVar2 + 1;
  }
  parametricOutputIndent = parametricOutputIndent - 1;
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

string Parametric::getAllParameters() const
{
	++parametricOutputIndent;
	string params;
	string indent = "";
	for (uint i=0; i<parametricOutputIndent; ++i)
		indent += "\t";
	for (uint i=0; i<parametricStrings.size(); ++i) {
		parametricOutputLineEnd = true;
		params += indent + parametricStrings[i] + ": " + getParameter( parametricStrings[i] );
		if (parametricOutputLineEnd) {
			params += "\n";
			parametricOutputLineEnd = false;
		}
	}
	--parametricOutputIndent;
	return params;
}